

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void calculate_scaled_size_helper(int *dim,int denom)

{
  undefined4 local_1c;
  undefined4 local_14;
  int min_dim;
  int denom_local;
  int *dim_local;
  
  if (denom != 8) {
    if (*dim < 0x11) {
      local_14 = *dim;
    }
    else {
      local_14 = 0x10;
    }
    *dim = (*dim * 8 + denom / 2) / denom;
    if (local_14 < *dim) {
      local_1c = *dim;
    }
    else {
      local_1c = local_14;
    }
    *dim = local_1c;
  }
  return;
}

Assistant:

static void calculate_scaled_size_helper(int *dim, int denom) {
  if (denom != SCALE_NUMERATOR) {
    // We need to ensure the constraint in "Appendix A" of the spec:
    // * FrameWidth is greater than or equal to 16
    // * FrameHeight is greater than or equal to 16
    // For this, we clamp the downscaled dimension to at least 16. One
    // exception: if original dimension itself was < 16, then we keep the
    // downscaled dimension to be same as the original, to ensure that resizing
    // is valid.
    const int min_dim = AOMMIN(16, *dim);
    // Use this version if we need *dim to be even
    // *width = (*width * SCALE_NUMERATOR + denom) / (2 * denom);
    // *width <<= 1;
    *dim = (*dim * SCALE_NUMERATOR + denom / 2) / (denom);
    *dim = AOMMAX(*dim, min_dim);
  }
}